

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.c
# Opt level: O3

uint64_t nn_stopwatch_term(nn_stopwatch *self)

{
  int iVar1;
  timeval tv;
  timeval local_18;
  
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    return (local_18.tv_sec * 1000000 + local_18.tv_usec) - self->start;
  }
  __assert_fail("rc == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/../src/utils/stopwatch.c"
                ,0x46,"uint64_t nn_stopwatch_term(struct nn_stopwatch *)");
}

Assistant:

uint64_t nn_stopwatch_term (struct nn_stopwatch *self)
{
    int rc;
    struct timeval tv;
    uint64_t end;

    rc = gettimeofday (&tv, NULL);
    assert (rc == 0);
    end = (uint64_t) (((uint64_t) tv.tv_sec) * 1000000 + tv.tv_usec);
    return end - self->start;
}